

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file.hpp
# Opt level: O0

string * __thiscall
czh::file::NonStreamFile::get_spec_line_abi_cxx11_
          (string *__return_storage_ptr__,NonStreamFile *this,size_t beg,size_t end,
          size_t linenosize)

{
  bool bVar1;
  undefined8 uVar2;
  size_t sVar3;
  size_type sVar4;
  const_reference pvVar5;
  reference pvVar6;
  unsigned_long *a;
  bool bVar7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  allocator<char> local_99;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  undefined1 local_68 [8];
  string addition;
  size_t i;
  bool first_line_no;
  ulong uStack_38;
  bool first_line_flag;
  size_t lineno;
  size_t linenosize_local;
  size_t end_local;
  size_t beg_local;
  NonStreamFile *this_local;
  string *ret;
  
  uStack_38 = 1;
  bVar7 = true;
  bVar1 = true;
  lineno = linenosize;
  linenosize_local = end;
  end_local = beg;
  beg_local = (size_t)this;
  this_local = (NonStreamFile *)__return_storage_ptr__;
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  for (addition.field_2._8_8_ = 0; uVar2 = addition.field_2._8_8_,
      sVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::size
                        (&this->code), (ulong)uVar2 < sVar4 && uStack_38 < linenosize_local;
      addition.field_2._8_8_ = addition.field_2._8_8_ + 1) {
    pvVar5 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
             operator[](&this->code,addition.field_2._8_8_);
    if (*pvVar5 == '\n') {
      uStack_38 = uStack_38 + 1;
      bVar7 = true;
    }
    else if (end_local <= uStack_38) {
      if (bVar7) {
        utils::to_str<unsigned_long&>((string *)local_68,(utils *)&stack0xffffffffffffffc8,a);
        sVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                size((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_68);
        sVar3 = lineno;
        if (sVar4 < lineno) {
          sVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                  size((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_68
                      );
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_98,sVar3 - sVar4,'0',&local_99);
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          operator+=(__return_storage_ptr__,&local_98);
          std::__cxx11::string::~string((string *)&local_98);
          std::allocator<char>::~allocator(&local_99);
        }
        if (bVar1) {
          bVar1 = false;
        }
        else {
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          operator+=(__return_storage_ptr__,'\n');
        }
        std::operator+(&local_c0,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_68
                       ,"| ");
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator+=
                  (__return_storage_ptr__,&local_c0);
        std::__cxx11::string::~string((string *)&local_c0);
        bVar7 = false;
        std::__cxx11::string::~string((string *)local_68);
      }
      pvVar5 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
               operator[](&this->code,addition.field_2._8_8_);
      if (*pvVar5 != '\r') {
        pvVar5 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                 operator[](&this->code,addition.field_2._8_8_);
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator+=
                  (__return_storage_ptr__,*pvVar5);
      }
    }
  }
  while( true ) {
    pvVar6 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::back
                       (__return_storage_ptr__);
    bVar7 = true;
    if (*pvVar6 != '\r') {
      pvVar6 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::back
                         (__return_storage_ptr__);
      bVar7 = *pvVar6 == '\n';
    }
    if (!bVar7) break;
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::pop_back
              (__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

[[nodiscard]] std::string get_spec_line(std::size_t beg, std::size_t end, std::size_t linenosize) const override
    {
      std::size_t lineno = 1;
      bool first_line_flag = true;
      bool first_line_no = true;
      std::string ret;
      for (std::size_t i = 0; i < code.size() && lineno < end; ++i)
      {
        if (code[i] == '\n')
        {
          ++lineno;
          first_line_flag = true;
          continue;
        }
        if (lineno >= beg)
        {
          if (first_line_flag)
          {
            std::string addition = utils::to_str(lineno);
            if (addition.size() < linenosize)
              ret += std::string(linenosize - addition.size(), '0');
            if (!first_line_no)
              ret += '\n';
            else
              first_line_no = false;
            ret += addition + "| ";
            first_line_flag = false;
          }
          if (code[i] != '\r')
            ret += code[i];
        }
      }
      while (ret.back() == '\r' || ret.back() == '\n')
      {
        ret.pop_back();
      }
      return ret;
    }